

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglplatformcontext.cpp
# Opt level: O0

void __thiscall QEGLPlatformContext::updateFormatFromGL(QEGLPlatformContext *this)

{
  bool bVar1;
  RenderableType RVar2;
  int iVar3;
  uint uVar4;
  undefined8 uVar5;
  char *extensionName;
  undefined8 uVar6;
  const_pointer piVar7;
  int *major_00;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  GLubyte *s;
  EGLConfig config;
  EGLBoolean ok;
  EGLContext tempContext;
  EGLSurface tempSurface;
  EGLSurface prevSurfaceRead;
  EGLSurface prevSurfaceDraw;
  EGLContext prevContext;
  EGLDisplay prevDisplay;
  GLint value;
  int minor;
  int major;
  QByteArray version;
  char *in_stack_ffffffffffffff28;
  OpenGLContextProfile OVar8;
  pair<int,_int> *__y;
  pair<int,_int> *in_stack_ffffffffffffff30;
  QByteArray *in_stack_ffffffffffffff38;
  QFlagsStorage<QSurfaceFormat::FormatOption> options;
  EGLDisplay in_stack_ffffffffffffff48;
  QByteArray *in_stack_ffffffffffffff50;
  int local_a4;
  long local_a0;
  long local_98;
  char *local_78;
  char local_68 [32];
  int local_48 [2];
  pair<int,_int> local_40;
  pair<int,_int> local_38;
  uint local_30;
  undefined1 local_2c [4];
  undefined4 local_28;
  undefined4 local_24;
  QByteArray local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_78 = (char *)eglGetCurrentDisplay();
  if (local_78 == (char *)0x0) {
    local_78 = in_RDI[1].context.file;
  }
  uVar5 = eglGetCurrentContext();
  extensionName = (char *)eglGetCurrentSurface(0x3059);
  uVar6 = eglGetCurrentSurface(0x305a);
  local_98 = 0;
  local_a0 = 0;
  bVar1 = QFlags<QEGLPlatformContext::Flag>::testFlag
                    ((QFlags<QEGLPlatformContext::Flag> *)in_stack_ffffffffffffff30,
                     (Flag)((ulong)in_stack_ffffffffffffff28 >> 0x20));
  if ((bVar1) || (bVar1 = q_hasEglExtension(in_RDI,extensionName), !bVar1)) {
    local_98 = (**(code **)(*(QSurfaceFormatPrivate **)&in_RDI->context + 2))();
  }
  local_a4 = eglMakeCurrent(in_RDI[1].context.file,local_98,local_98,(in_RDI->context).category);
  if (local_a4 == 0) {
    in_stack_ffffffffffffff38 =
         (QByteArray *)
         q_configFromGLFormat
                   (in_stack_ffffffffffffff48,(QSurfaceFormat *)in_RDI,
                    SUB81((ulong)in_stack_ffffffffffffff38 >> 0x38,0),(int)in_stack_ffffffffffffff38
                   );
    in_stack_ffffffffffffff30 = (pair<int,_int> *)in_RDI[1].context.file;
    in_stack_ffffffffffffff50 = in_stack_ffffffffffffff38;
    piVar7 = QList<int>::constData((QList<int> *)0xa915f2);
    local_a0 = eglCreateContext(in_stack_ffffffffffffff30,in_stack_ffffffffffffff38,0,piVar7);
    if (local_a0 != 0) {
      local_a4 = eglMakeCurrent(in_RDI[1].context.file,local_98,local_98,local_a0);
    }
  }
  if (local_a4 == 0) {
    QMessageLogger::QMessageLogger
              (in_RDI,(char *)in_stack_ffffffffffffff38,
               (int)((ulong)in_stack_ffffffffffffff30 >> 0x20),in_stack_ffffffffffffff28);
    uVar4 = eglGetError();
    QMessageLogger::warning
              (local_68,
               "QEGLPlatformContext: Failed to make temporary surface current, format not updated (%x)"
               ,(ulong)uVar4);
  }
  else {
    RVar2 = QSurfaceFormat::renderableType((QSurfaceFormat *)&in_RDI[1].context.category);
    options.i = (Int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
    OVar8 = (OpenGLContextProfile)((ulong)in_stack_ffffffffffffff28 >> 0x20);
    if ((RVar2 == OpenGL) ||
       (RVar2 = QSurfaceFormat::renderableType((QSurfaceFormat *)&in_RDI[1].context.category),
       RVar2 == OpenGLES)) {
      major_00 = (int *)glGetString(0x1f02);
      if (major_00 != (int *)0x0) {
        local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_20.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
        local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        QByteArray::QByteArray(&local_20,(char *)major_00,-1);
        local_24 = 0xaaaaaaaa;
        local_28 = 0xaaaaaaaa;
        bVar1 = QPlatformOpenGLContext::parseOpenGLVersion
                          (in_stack_ffffffffffffff50,major_00,(int *)in_RDI);
        if (bVar1) {
          QSurfaceFormat::setMajorVersion((QSurfaceFormat *)in_stack_ffffffffffffff30,OVar8);
          QSurfaceFormat::setMinorVersion((QSurfaceFormat *)in_stack_ffffffffffffff30,OVar8);
        }
        QByteArray::~QByteArray((QByteArray *)0xa9173e);
      }
      QSurfaceFormat::setProfile((QSurfaceFormat *)in_stack_ffffffffffffff30,OVar8);
      __y = (pair<int,_int> *)&in_RDI[1].context.category;
      memset(local_2c,0,4);
      QFlags<QSurfaceFormat::FormatOption>::QFlags((QFlags<QSurfaceFormat::FormatOption> *)0xa9177c)
      ;
      QSurfaceFormat::setOptions
                ((QSurfaceFormat *)in_stack_ffffffffffffff30,(FormatOptions)options.i);
      RVar2 = QSurfaceFormat::renderableType((QSurfaceFormat *)&in_RDI[1].context.category);
      if (RVar2 == OpenGL) {
        iVar3 = QSurfaceFormat::majorVersion((QSurfaceFormat *)&in_RDI[1].context.category);
        if (iVar3 < 3) {
          QSurfaceFormat::setOption
                    ((QSurfaceFormat *)in_stack_ffffffffffffff30,(FormatOption)((ulong)__y >> 0x20),
                     SUB81((ulong)__y >> 0x18,0));
        }
        else {
          local_30 = 0;
          glGetIntegerv(0x821e,&local_30);
          if ((local_30 & 1) == 0) {
            QSurfaceFormat::setOption
                      ((QSurfaceFormat *)in_stack_ffffffffffffff30,
                       (FormatOption)((ulong)__y >> 0x20),SUB81((ulong)__y >> 0x18,0));
          }
          if ((local_30 & 2) != 0) {
            QSurfaceFormat::setOption
                      ((QSurfaceFormat *)in_stack_ffffffffffffff30,
                       (FormatOption)((ulong)__y >> 0x20),SUB81((ulong)__y >> 0x18,0));
          }
          local_38 = QSurfaceFormat::version((QSurfaceFormat *)in_stack_ffffffffffffff30);
          local_48[1] = 3;
          local_48[0] = 2;
          std::pair<int,_int>::pair<int,_int,_true>(&local_40,local_48 + 1,local_48);
          bVar1 = std::operator>=(in_stack_ffffffffffffff30,__y);
          OVar8 = (OpenGLContextProfile)((ulong)__y >> 0x20);
          if (bVar1) {
            local_30 = 0;
            glGetIntegerv(0x9126,&local_30);
            if ((local_30 & 1) == 0) {
              if ((local_30 & 2) != 0) {
                QSurfaceFormat::setProfile((QSurfaceFormat *)in_stack_ffffffffffffff30,OVar8);
              }
            }
            else {
              QSurfaceFormat::setProfile((QSurfaceFormat *)in_stack_ffffffffffffff30,OVar8);
            }
          }
        }
      }
    }
    (**(code **)(*(long *)&in_RDI->context + 0xa0))();
    eglMakeCurrent(local_78,extensionName,uVar6,uVar5);
  }
  if (local_98 != 0) {
    (**(code **)(*(long *)&in_RDI->context + 0x98))(in_RDI,local_98);
  }
  if (local_a0 != 0) {
    eglDestroyContext(in_RDI[1].context.file,local_a0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QEGLPlatformContext::updateFormatFromGL()
{
#ifndef QT_NO_OPENGL
    // Have to save & restore to prevent QOpenGLContext::currentContext() from becoming
    // inconsistent after QOpenGLContext::create().
    EGLDisplay prevDisplay = eglGetCurrentDisplay();
    if (prevDisplay == EGL_NO_DISPLAY) // when no context is current
        prevDisplay = m_eglDisplay;
    EGLContext prevContext = eglGetCurrentContext();
    EGLSurface prevSurfaceDraw = eglGetCurrentSurface(EGL_DRAW);
    EGLSurface prevSurfaceRead = eglGetCurrentSurface(EGL_READ);

    // Rely on the surfaceless extension, if available. This is beneficial since we can
    // avoid creating an extra pbuffer surface which is apparently troublesome with some
    // drivers (Mesa) when certain attributes are present (multisampling).
    EGLSurface tempSurface = EGL_NO_SURFACE;
    EGLContext tempContext = EGL_NO_CONTEXT;
    if (m_flags.testFlag(NoSurfaceless) || !q_hasEglExtension(m_eglDisplay, "EGL_KHR_surfaceless_context"))
        tempSurface = createTemporaryOffscreenSurface();

    EGLBoolean ok = eglMakeCurrent(m_eglDisplay, tempSurface, tempSurface, m_eglContext);
    if (!ok) {
        EGLConfig config = q_configFromGLFormat(m_eglDisplay, m_format, false, EGL_PBUFFER_BIT);
        tempContext = eglCreateContext(m_eglDisplay, config, nullptr, m_contextAttrs.constData());
        if (tempContext != EGL_NO_CONTEXT)
            ok = eglMakeCurrent(m_eglDisplay, tempSurface, tempSurface, tempContext);
    }
    if (ok) {
        if (m_format.renderableType() == QSurfaceFormat::OpenGL
            || m_format.renderableType() == QSurfaceFormat::OpenGLES) {
            const GLubyte *s = glGetString(GL_VERSION);
            if (s) {
                QByteArray version = QByteArray(reinterpret_cast<const char *>(s));
                int major, minor;
                if (QPlatformOpenGLContext::parseOpenGLVersion(version, major, minor)) {
                    m_format.setMajorVersion(major);
                    m_format.setMinorVersion(minor);
                }
            }
            m_format.setProfile(QSurfaceFormat::NoProfile);
            m_format.setOptions(QSurfaceFormat::FormatOptions());
            if (m_format.renderableType() == QSurfaceFormat::OpenGL) {
                // Check profile and options.
                if (m_format.majorVersion() < 3) {
                    m_format.setOption(QSurfaceFormat::DeprecatedFunctions);
                } else {
                    GLint value = 0;
                    glGetIntegerv(GL_CONTEXT_FLAGS, &value);
                    if (!(value & GL_CONTEXT_FLAG_FORWARD_COMPATIBLE_BIT))
                        m_format.setOption(QSurfaceFormat::DeprecatedFunctions);
                    if (value & GL_CONTEXT_FLAG_DEBUG_BIT)
                        m_format.setOption(QSurfaceFormat::DebugContext);
                    if (m_format.version() >= std::pair(3, 2)) {
                        value = 0;
                        glGetIntegerv(GL_CONTEXT_PROFILE_MASK, &value);
                        if (value & GL_CONTEXT_CORE_PROFILE_BIT)
                            m_format.setProfile(QSurfaceFormat::CoreProfile);
                        else if (value & GL_CONTEXT_COMPATIBILITY_PROFILE_BIT)
                            m_format.setProfile(QSurfaceFormat::CompatibilityProfile);
                    }
                }
            }
        }
        runGLChecks();
        eglMakeCurrent(prevDisplay, prevSurfaceDraw, prevSurfaceRead, prevContext);
    } else {
        qWarning("QEGLPlatformContext: Failed to make temporary surface current, format not updated (%x)", eglGetError());
    }
    if (tempSurface != EGL_NO_SURFACE)
        destroyTemporaryOffscreenSurface(tempSurface);
    if (tempContext != EGL_NO_CONTEXT)
        eglDestroyContext(m_eglDisplay, tempContext);
#endif // QT_NO_OPENGL
}